

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QPolygonF * __thiscall QGraphicsItem::mapFromParent(QGraphicsItem *this,QRectF *rect)

{
  QGraphicsItemPrivate *pQVar1;
  QRectF *in_RDX;
  QGraphicsItemPrivate *in_RSI;
  QPointF *in_RDI;
  long in_FS_OFFSET;
  QPointF *p;
  QPointF *p_00;
  QRectF *in_stack_ffffffffffffff10;
  undefined1 local_c8 [112];
  bool local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  p = in_RDI;
  p_00 = in_RDI;
  pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)&in_RSI->extras);
  if (pQVar1->transformData == (TransformData *)0x0) {
    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
              ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *
               )&in_RSI->extras);
    ::operator-(p);
    QRectF::translated(in_stack_ffffffffffffff10,p_00);
    QPolygonF::QPolygonF((QPolygonF *)in_RDI,(QRectF *)local_c8);
  }
  else {
    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
              ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *
               )&in_RSI->extras);
    QGraphicsItemPrivate::transformToParent(in_RSI);
    QTransform::inverted(local_58);
    QPolygonF::QPolygonF((QPolygonF *)&stack0xffffffffffffff10,in_RDX);
    QTransform::map((QPolygonF *)in_RDI);
    QPolygonF::~QPolygonF((QPolygonF *)0x983f1f);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QPolygonF *)p;
  }
  __stack_chk_fail();
}

Assistant:

QPolygonF QGraphicsItem::mapFromParent(const QRectF &rect) const
{
    // COMBINE
    if (!d_ptr->transformData)
        return rect.translated(-d_ptr->pos);
    return d_ptr->transformToParent().inverted().map(rect);
}